

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O1

bool __thiscall
kernel::BlockTreeDB::WriteBatchSync
          (BlockTreeDB *this,
          vector<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>
          *fileInfo,int nLastFile,
          vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *blockinfo)

{
  pointer ppVar1;
  pointer ppCVar2;
  uint256 *puVar3;
  bool bVar4;
  type *file;
  pointer ppVar5;
  pointer ppCVar6;
  long in_FS_OFFSET;
  CDBBatch batch;
  CDBBatch local_1a0;
  int local_144;
  CDiskBlockIndex local_140;
  uchar local_88 [8];
  uchar auStack_80 [8];
  uchar local_78 [8];
  uchar auStack_70 [23];
  pair<unsigned_char,_uint256> local_59;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_144 = nLastFile;
  CDBBatch::CDBBatch(&local_1a0,&this->super_CDBWrapper);
  ppVar5 = (fileInfo->
           super__Vector_base<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (fileInfo->
           super__Vector_base<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 != ppVar1) {
    do {
      local_140.super_CBlockIndex.phashBlock =
           (uint256 *)((ulong)(uint)ppVar5->first << 0x20 | 0x66);
      CDBBatch::Write<std::pair<unsigned_char,int>,CBlockFileInfo>
                (&local_1a0,(pair<unsigned_char,_int> *)&local_140,ppVar5->second);
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar1);
  }
  CDBBatch::Write<unsigned_char,int>(&local_1a0,"l\x01",&local_144);
  ppCVar6 = (blockinfo->
            super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar2 = (blockinfo->
            super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar6 != ppCVar2) {
    do {
      puVar3 = (*ppCVar6)->phashBlock;
      if (puVar3 == (uint256 *)0x0) {
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      local_88 = *(uchar (*) [8])(puVar3->super_base_blob<256U>).m_data._M_elems;
      auStack_80 = *(uchar (*) [8])((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
      local_78 = *(uchar (*) [8])((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
      auStack_70._0_8_ = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18);
      local_59.first = 'b';
      local_59.second.super_base_blob<256U>.m_data._M_elems._0_8_ = local_88;
      local_59.second.super_base_blob<256U>.m_data._M_elems._8_8_ = auStack_80;
      local_59.second.super_base_blob<256U>.m_data._M_elems._16_8_ = local_78;
      local_59.second.super_base_blob<256U>.m_data._M_elems._24_8_ = auStack_70._0_8_;
      CDiskBlockIndex::CDiskBlockIndex(&local_140,*ppCVar6);
      CDBBatch::Write<std::pair<unsigned_char,uint256>,CDiskBlockIndex>
                (&local_1a0,&local_59,&local_140);
      ppCVar6 = ppCVar6 + 1;
    } while (ppCVar6 != ppCVar2);
  }
  bVar4 = CDBWrapper::WriteBatch(&this->super_CDBWrapper,&local_1a0,true);
  CDBBatch::~CDBBatch(&local_1a0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockTreeDB::WriteBatchSync(const std::vector<std::pair<int, const CBlockFileInfo*>>& fileInfo, int nLastFile, const std::vector<const CBlockIndex*>& blockinfo)
{
    CDBBatch batch(*this);
    for (const auto& [file, info] : fileInfo) {
        batch.Write(std::make_pair(DB_BLOCK_FILES, file), *info);
    }
    batch.Write(DB_LAST_BLOCK, nLastFile);
    for (const CBlockIndex* bi : blockinfo) {
        batch.Write(std::make_pair(DB_BLOCK_INDEX, bi->GetBlockHash()), CDiskBlockIndex{bi});
    }
    return WriteBatch(batch, true);
}